

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algebraic_simplification.hpp
# Opt level: O0

void __thiscall
optimization::algebraic_simplification::AlgebraicSimplification::optimize_func
          (AlgebraicSimplification *this,string *name,MirFunction *mirFunction)

{
  uint32_t uVar1;
  Value *pVVar2;
  bool bVar3;
  int iVar4;
  pointer ppVar5;
  Value *pVVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  VarId *in_RDX;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *in_stack_000000b8;
  MirFunction *in_stack_000000c0;
  Value *in_stack_000000c8;
  VarId *in_stack_000000d0;
  int32_t in_stack_000000dc;
  AlgebraicSimplification *in_stack_000000e0;
  size_t in_stack_000000f0;
  uint32_t *in_stack_000000f8;
  uint32_t tmp2;
  uint32_t tmp1;
  uint32_t offIndex_1;
  uint32_t rem;
  uint32_t index_2;
  int32_t num_2;
  uint32_t offIndex;
  uint32_t mul_1;
  uint32_t index_1;
  int32_t num_1;
  uint32_t mul;
  uint32_t index;
  int32_t num;
  Value tmp;
  OpInst *opPtr;
  Inst *instIter;
  size_t i;
  iterator blksIter;
  Value *in_stack_fffffffffffffb38;
  Value *in_stack_fffffffffffffb40;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  *in_stack_fffffffffffffb48;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *in_stack_fffffffffffffb50;
  const_iterator in_stack_fffffffffffffb58;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *in_stack_fffffffffffffb68;
  void *in_stack_fffffffffffffb70;
  Value *in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  uint in_stack_fffffffffffffb84;
  VarId *_dest;
  OpInst *this_00;
  Op *in_stack_fffffffffffffbb0;
  Value *in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbc0;
  uint in_stack_fffffffffffffbc4;
  uint uVar10;
  VarId *in_stack_fffffffffffffbc8;
  MirFunction *in_stack_fffffffffffffc08;
  AlgebraicSimplification *in_stack_fffffffffffffc10;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> local_308 [13];
  undefined1 local_2a0 [40];
  VarId local_278;
  uint32_t local_264;
  uint32_t local_260;
  Value local_25c;
  uint local_234;
  int local_230;
  uint local_22c;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_228;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_220;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_218;
  Value local_1d8 [3];
  AlgebraicSimplification local_178;
  uint local_150;
  int local_14c;
  uint local_128;
  undefined4 local_114;
  uint local_90;
  int local_8c;
  uint local_64;
  pointer local_40;
  pointer local_38;
  Value *local_30;
  _Self local_28;
  _Self local_20;
  VarId *local_18;
  
  local_18 = in_RDX;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_fffffffffffffb38);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_fffffffffffffb38);
    bVar3 = std::operator!=(&local_20,&local_28);
    if (!bVar3) break;
    local_30 = (Value *)0x0;
    while( true ) {
      pVVar2 = local_30;
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x19ed98)
      ;
      pVVar6 = (Value *)std::
                        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ::size(&(ppVar5->second).inst);
      if (pVVar6 <= pVVar2) break;
      std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x19edc9);
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::at((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            *)in_stack_fffffffffffffb40,(size_type)in_stack_fffffffffffffb38);
      local_38 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::get
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            in_stack_fffffffffffffb40);
      iVar4 = (*(local_38->super_Displayable)._vptr_Displayable[1])();
      if (iVar4 == 1) {
        local_40 = local_38;
        uVar1 = local_38[3].dest.id;
        if (uVar1 == 2) {
          bVar3 = mir::inst::Value::is_immediate((Value *)0x19ee6a);
          if ((bVar3) && (bVar3 = mir::inst::Value::is_immediate((Value *)0x19ee81), !bVar3)) {
            mir::inst::Value::Value(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
            mir::inst::Value::operator=(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
            mir::inst::Value::operator=(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
          }
          bVar3 = mir::inst::Value::is_immediate((Value *)0x19eee5);
          if ((!bVar3) && (bVar3 = mir::inst::Value::is_immediate((Value *)0x19eefe), bVar3)) {
            puVar7 = (uint *)mir::inst::Value::get_if<int>((Value *)0x19ef18);
            local_64 = *puVar7;
            if (local_64 != 0) {
              if (local_64 == 0xffffffff) {
                local_40[3].dest.id = 1;
                mir::inst::Value::operator=(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
                mir::inst::Value::Value
                          (in_stack_fffffffffffffb40,
                           (int32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20));
                mir::inst::Value::operator=(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
              }
              else {
                uVar10 = local_64;
                if ((int)local_64 < 1) {
                  uVar10 = -local_64;
                }
                uVar8 = local_64;
                if ((int)local_64 < 1) {
                  uVar8 = -local_64;
                }
                if ((uVar10 & uVar8 - 1) == 0) {
                  local_90 = local_64;
                  if ((int)local_64 < 1) {
                    local_90 = -local_64;
                  }
                  local_8c = 0;
                  for (; (local_90 & 1) == 0; local_90 = local_90 >> 1) {
                    local_8c = local_8c + 1;
                  }
                  local_40[3].dest.id = 0x10;
                  mir::inst::Value::Value
                            (in_stack_fffffffffffffb40,
                             (int32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20));
                  mir::inst::Value::operator=(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
                  if ((int)local_64 < 0) {
                    std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                              ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                               0x19f067);
                    mir::inst::Value::Value
                              (in_stack_fffffffffffffb40,
                               (int32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20));
                    mir::inst::VarId::VarId
                              ((VarId *)in_stack_fffffffffffffb40,(VarId *)in_stack_fffffffffffffb38
                              );
                    mir::inst::Value::Value
                              (in_stack_fffffffffffffb40,(VarId *)in_stack_fffffffffffffb38);
                    local_114 = 1;
                    std::
                    make_unique<mir::inst::OpInst,mir::inst::VarId&,mir::inst::Value,mir::inst::Value,mir::inst::Op>
                              (in_stack_fffffffffffffbc8,
                               (Value *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0
                                                ),in_stack_fffffffffffffbb8,
                               in_stack_fffffffffffffbb0);
                    std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
                    unique_ptr<mir::inst::OpInst,std::default_delete<mir::inst::OpInst>,void>
                              ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *
                               )in_stack_fffffffffffffb50,
                               (unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>
                                *)in_stack_fffffffffffffb48);
                    insertInst((AlgebraicSimplification *)
                               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                               (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                *)in_stack_fffffffffffffb78,(size_t)in_stack_fffffffffffffb70,
                               in_stack_fffffffffffffb68);
                    std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                    ~unique_ptr((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                 *)in_stack_fffffffffffffb50);
                    std::unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>::
                    ~unique_ptr((unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>
                                 *)in_stack_fffffffffffffb40);
                  }
                }
              }
            }
          }
        }
        else if (uVar1 == 3) {
          bVar3 = mir::inst::Value::is_immediate((Value *)0x19f1e0);
          if ((!bVar3) && (bVar3 = mir::inst::Value::is_immediate((Value *)0x19f1f9), bVar3)) {
            puVar7 = (uint *)mir::inst::Value::get_if<int>((Value *)0x19f213);
            uVar10 = *puVar7;
            local_128 = uVar10;
            if (uVar10 != 0) {
              if (uVar10 == 0xffffffff) {
                local_40[3].dest.id = 1;
                mir::inst::Value::operator=(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
                mir::inst::Value::Value
                          (in_stack_fffffffffffffb40,
                           (int32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20));
                mir::inst::Value::operator=(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
              }
              else {
                uVar8 = uVar10;
                if ((int)uVar10 < 1) {
                  uVar8 = -uVar10;
                }
                uVar9 = uVar10;
                if ((int)uVar10 < 1) {
                  uVar9 = -uVar10;
                }
                if ((uVar8 & uVar9 - 1) == 0) {
                  local_150 = uVar10;
                  if ((int)uVar10 < 1) {
                    local_150 = -uVar10;
                  }
                  local_14c = 0;
                  for (; (local_150 & 1) == 0; local_150 = local_150 >> 1) {
                    local_14c = local_14c + 1;
                  }
                  local_40[3].dest.id = 0x12;
                  mir::inst::Value::Value
                            (in_stack_fffffffffffffb40,
                             (int32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20));
                  mir::inst::Value::operator=(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
                  if ((int)local_128 < 0) {
                    std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                              ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                               0x19f362);
                    in_stack_fffffffffffffc08 =
                         (MirFunction *)
                         &(((_Rep_type *)&local_30->super_Displayable)->_M_impl).field_0x1;
                    mir::inst::Value::Value
                              (in_stack_fffffffffffffb40,
                               (int32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20));
                    mir::inst::VarId::VarId
                              ((VarId *)in_stack_fffffffffffffb40,(VarId *)in_stack_fffffffffffffb38
                              );
                    mir::inst::Value::Value
                              (in_stack_fffffffffffffb40,(VarId *)in_stack_fffffffffffffb38);
                    local_1d8[0].super_Displayable._vptr_Displayable._4_4_ = 1;
                    std::
                    make_unique<mir::inst::OpInst,mir::inst::VarId&,mir::inst::Value,mir::inst::Value,mir::inst::Op>
                              (in_stack_fffffffffffffbc8,
                               (Value *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0
                                                ),in_stack_fffffffffffffbb8,
                               in_stack_fffffffffffffbb0);
                    in_stack_fffffffffffffc10 = &local_178;
                    std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
                    unique_ptr<mir::inst::OpInst,std::default_delete<mir::inst::OpInst>,void>
                              ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *
                               )in_stack_fffffffffffffb50,
                               (unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>
                                *)in_stack_fffffffffffffb48);
                    insertInst((AlgebraicSimplification *)
                               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                               (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                *)in_stack_fffffffffffffb78,(size_t)in_stack_fffffffffffffb70,
                               in_stack_fffffffffffffb68);
                    std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                    ~unique_ptr((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                 *)in_stack_fffffffffffffb50);
                    std::unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>::
                    ~unique_ptr((unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>
                                 *)in_stack_fffffffffffffb40);
                  }
                }
                else {
                  local_1d8[0].super_Displayable._vptr_Displayable._0_4_ = 0;
                  mir::inst::VarId::VarId
                            ((VarId *)in_stack_fffffffffffffb40,(VarId *)in_stack_fffffffffffffb38);
                  mir::inst::Value::Value(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
                  in_stack_fffffffffffffbc8 = local_18;
                  std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                            ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                             0x19f52a);
                  in_stack_fffffffffffffb40 = local_1d8;
                  in_stack_fffffffffffffb38 = local_30;
                  insertDivideInstsFromPaper
                            (in_stack_000000e0,in_stack_000000dc,in_stack_000000d0,in_stack_000000c8
                             ,in_stack_000000c0,in_stack_000000b8,in_stack_000000f0,
                             in_stack_000000f8);
                  std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                            ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                             0x19f587);
                  std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                            ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                             0x19f5a4);
                  local_220 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                              std::
                              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                              ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                       *)in_stack_fffffffffffffb38);
                  local_218 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                              __gnu_cxx::
                              __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                              ::operator+(in_stack_fffffffffffffb48,
                                          (difference_type)in_stack_fffffffffffffb40);
                  __gnu_cxx::
                  __normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>const*,std::vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>>
                  ::
                  __normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>*>
                            ((__normal_iterator<const_std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                              *)in_stack_fffffffffffffb40,
                             (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                              *)in_stack_fffffffffffffb38);
                  local_228 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                              std::
                              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                              ::erase(in_stack_fffffffffffffb50,in_stack_fffffffffffffb58);
                  local_30 = (Value *)&local_30[-1].field_0x1f;
                  in_stack_fffffffffffffbc4 = uVar10;
                }
              }
            }
          }
        }
        else if (((uVar1 == 5) &&
                 (bVar3 = mir::inst::Value::is_immediate((Value *)0x19f63b), !bVar3)) &&
                (bVar3 = mir::inst::Value::is_immediate((Value *)0x19f654), bVar3)) {
          puVar7 = (uint *)mir::inst::Value::get_if<int>((Value *)0x19f66e);
          local_22c = *puVar7;
          if (local_22c != 0) {
            uVar10 = local_22c;
            if ((int)local_22c < 1) {
              uVar10 = -local_22c;
            }
            uVar8 = local_22c;
            if ((int)local_22c < 1) {
              uVar8 = -local_22c;
            }
            if ((uVar10 & uVar8 - 1) == 0) {
              local_234 = local_22c;
              if ((int)local_22c < 1) {
                local_234 = -local_22c;
              }
              local_230 = 0;
              for (; (local_234 & 1) == 0; local_234 = local_234 >> 1) {
                local_230 = local_230 + 1;
              }
              local_40[3].dest.id = 0xc;
              mir::inst::Value::Value
                        (in_stack_fffffffffffffb40,
                         (int32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20));
              mir::inst::Value::operator=(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
            }
            else {
              local_25c.super_Displayable._vptr_Displayable._0_4_ = 0;
              local_260 = getNewVar(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
              _dest = &local_278;
              in_stack_fffffffffffffb84 = local_22c;
              mir::inst::VarId::VarId
                        ((VarId *)in_stack_fffffffffffffb40,
                         (uint32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20));
              this_00 = (OpInst *)(local_2a0 + 8);
              mir::inst::Value::Value(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
              std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x19f7d6);
              in_stack_fffffffffffffb40 = &local_25c;
              in_stack_fffffffffffffb38 = local_30;
              insertDivideInstsFromPaper
                        (in_stack_000000e0,in_stack_000000dc,in_stack_000000d0,in_stack_000000c8,
                         in_stack_000000c0,in_stack_000000b8,in_stack_000000f0,in_stack_000000f8);
              local_264 = getNewVar(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
              std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x19f83d);
              local_25c.super_Displayable._vptr_Displayable._0_4_ =
                   (uint)local_25c.super_Displayable._vptr_Displayable + 1;
              in_stack_fffffffffffffbb0 =
                   (Op *)(&(((_Rep_type *)&local_30->super_Displayable)->_M_impl).field_0x0 +
                         (uint)local_25c.super_Displayable._vptr_Displayable);
              in_stack_fffffffffffffbb8 = (Value *)operator_new(0x60);
              mir::inst::VarId::VarId
                        ((VarId *)in_stack_fffffffffffffb40,
                         (uint32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20));
              mir::inst::VarId::VarId
                        ((VarId *)in_stack_fffffffffffffb40,
                         (uint32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20));
              mir::inst::Value::Value(in_stack_fffffffffffffb40,(VarId *)in_stack_fffffffffffffb38);
              mir::inst::Value::Value
                        (in_stack_fffffffffffffb40,
                         (int32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20));
              mir::inst::OpInst::OpInst
                        (this_00,_dest,
                         (Value *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                         in_stack_fffffffffffffb78,(Op)((ulong)in_stack_fffffffffffffb70 >> 0x20));
              in_stack_fffffffffffffb78 = (Value *)local_2a0;
              std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
              unique_ptr<std::default_delete<mir::inst::Inst>,void>
                        ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         in_stack_fffffffffffffb40,(pointer)in_stack_fffffffffffffb38);
              insertInst((AlgebraicSimplification *)
                         CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                         (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          *)in_stack_fffffffffffffb78,(size_t)in_stack_fffffffffffffb70,
                         in_stack_fffffffffffffb68);
              std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                        ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         in_stack_fffffffffffffb50);
              std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x19f950);
              local_25c.super_Displayable._vptr_Displayable._0_4_ =
                   (uint)local_25c.super_Displayable._vptr_Displayable + 1;
              in_stack_fffffffffffffb68 =
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   (&(((_Rep_type *)&local_30->super_Displayable)->_M_impl).field_0x0 +
                   (uint)local_25c.super_Displayable._vptr_Displayable);
              in_stack_fffffffffffffb70 = operator_new(0x60);
              mir::inst::VarId::VarId
                        ((VarId *)in_stack_fffffffffffffb40,(VarId *)in_stack_fffffffffffffb38);
              mir::inst::Value::Value(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
              mir::inst::VarId::VarId
                        ((VarId *)in_stack_fffffffffffffb40,
                         (uint32_t)((ulong)in_stack_fffffffffffffb38 >> 0x20));
              mir::inst::Value::Value(in_stack_fffffffffffffb40,(VarId *)in_stack_fffffffffffffb38);
              mir::inst::OpInst::OpInst
                        (this_00,_dest,
                         (Value *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                         in_stack_fffffffffffffb78,(Op)((ulong)in_stack_fffffffffffffb70 >> 0x20));
              in_stack_fffffffffffffb58._M_current = local_308;
              std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
              unique_ptr<std::default_delete<mir::inst::Inst>,void>
                        ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         in_stack_fffffffffffffb40,(pointer)in_stack_fffffffffffffb38);
              insertInst((AlgebraicSimplification *)
                         CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                         (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          *)in_stack_fffffffffffffb78,(size_t)in_stack_fffffffffffffb70,
                         in_stack_fffffffffffffb68);
              std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                        ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         in_stack_fffffffffffffb50);
              ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::
                       operator->((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                                  0x19fa62);
              in_stack_fffffffffffffb50 = &(ppVar5->second).inst;
              std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x19fa7c);
              std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)in_stack_fffffffffffffb38);
              __gnu_cxx::
              __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
              ::operator+(in_stack_fffffffffffffb48,(difference_type)in_stack_fffffffffffffb40);
              __gnu_cxx::
              __normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>const*,std::vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>>
              ::
              __normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>*>
                        ((__normal_iterator<const_std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                          *)in_stack_fffffffffffffb40,
                         (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                          *)in_stack_fffffffffffffb38);
              std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::erase(in_stack_fffffffffffffb50,in_stack_fffffffffffffb58);
              local_30 = (Value *)&local_30[-1].field_0x1f;
            }
          }
        }
      }
      local_30 = (Value *)&(((_Rep_type *)&local_30->super_Displayable)->_M_impl).field_0x1;
    }
    std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
               in_stack_fffffffffffffb48,(int)((ulong)in_stack_fffffffffffffb40 >> 0x20));
  }
  return;
}

Assistant:

void optimize_func(std::string name, mir::inst::MirFunction& mirFunction) {
    for (auto blksIter = mirFunction.basic_blks.begin();
         blksIter != mirFunction.basic_blks.end(); blksIter++) {
      for (size_t i = 0; i < blksIter->second.inst.size(); i++) {
        mir::inst::Inst* instIter = blksIter->second.inst.at(i).get();
        switch (instIter->inst_kind()) {
          case mir::inst::InstKind::Op: {
            mir::inst::OpInst* opPtr = (mir::inst::OpInst*)instIter;
            switch (opPtr->op) {
              case mir::inst::Op::Mul: {
                if (opPtr->lhs.is_immediate() && !opPtr->rhs.is_immediate()) {
                  mir::inst::Value tmp = opPtr->lhs;
                  opPtr->lhs = opPtr->rhs;
                  opPtr->rhs = tmp;
                }
                if (!opPtr->lhs.is_immediate() && opPtr->rhs.is_immediate()) {
                  int32_t num = *(opPtr->rhs.get_if<int32_t>());
                  if (num != 0) {
                    if (num == -1) {
                      opPtr->op = mir::inst::Op::Sub;
                      opPtr->rhs = opPtr->lhs;
                      opPtr->lhs = mir::inst::Value(0);
                    } else if ((std::abs(num) & (std::abs(num) - 1)) == 0) {
                      uint32_t index;
                      uint32_t mul;

                      mul = std::abs(num);
                      for (index = 0; (mul & 1) == 0; mul >>= 1, index++)
                        ;
                      opPtr->op = mir::inst::Op::Shl;
                      opPtr->rhs = mir::inst::Value(index);

                      if (num < 0) {
                        insertInst(blksIter->second.inst, i + 1,
                                   std::make_unique<mir::inst::OpInst>(
                                       opPtr->dest, mir::inst::Value(0),
                                       mir::inst::Value(opPtr->dest),
                                       mir::inst::Op::Sub));
                      }
                    }
                  }
                }
                break;
              }
              case mir::inst::Op::Div: {
                if (!opPtr->lhs.is_immediate() && opPtr->rhs.is_immediate()) {
                  int32_t num = *(opPtr->rhs.get_if<int32_t>());
                  if (num != 0) {
                    if (num == -1) {
                      opPtr->op = mir::inst::Op::Sub;
                      opPtr->rhs = opPtr->lhs;
                      opPtr->lhs = mir::inst::Value(0);
                    } else if ((std::abs(num) & (std::abs(num) - 1)) == 0) {
                      uint32_t index;
                      uint32_t mul;

                      mul = std::abs(num);
                      for (index = 0; (mul & 1) == 0; mul >>= 1, index++)
                        ;
                      opPtr->op = mir::inst::Op::ShrA;
                      opPtr->rhs = mir::inst::Value(index);

                      if (num < 0) {
                        insertInst(blksIter->second.inst, i + 1,
                                   std::make_unique<mir::inst::OpInst>(
                                       opPtr->dest, mir::inst::Value(0),
                                       mir::inst::Value(opPtr->dest),
                                       mir::inst::Op::Sub));
                      }
                    } else {
                      uint32_t offIndex;

                      offIndex = 0;

                      insertDivideInstsFromPaper(
                          num, opPtr->dest, opPtr->lhs, mirFunction,
                          blksIter->second.inst, i, offIndex);

                      blksIter->second.inst.erase(
                          blksIter->second.inst.begin() + i);
                      i--;
                    }
                  }
                }
                break;
              }
              case mir::inst::Op::Rem: {
                if (!opPtr->lhs.is_immediate() && opPtr->rhs.is_immediate()) {
                  int32_t num = *(opPtr->rhs.get_if<int32_t>());
                  if (num != 0) {
                    if ((std::abs(num) & (std::abs(num) - 1)) == 0) {
                      uint32_t index;
                      uint32_t rem;

                      rem = std::abs(num);
                      for (index = 0; (rem & 1) == 0; rem >>= 1, index++)
                        ;
                      opPtr->op = mir::inst::Op::And;
                      opPtr->rhs = mir::inst::Value(((uint32_t)1 << index) - 1);
                      // TODO: deal the problem of negative lhs
                    } else {
                      uint32_t offIndex;

                      uint32_t tmp1;
                      uint32_t tmp2;

                      offIndex = 0;

                      tmp1 = getNewVar(mirFunction);
                      insertDivideInstsFromPaper(
                          num, mir::inst::VarId(tmp1), opPtr->lhs, mirFunction,
                          blksIter->second.inst, i, offIndex);
                      tmp2 = getNewVar(mirFunction);
                      insertInst(
                          blksIter->second.inst, i + ++offIndex,
                          std::unique_ptr<mir::inst::Inst>(
                              new mir::inst::OpInst(mir::inst::VarId(tmp2),
                                                    mir::inst::VarId(tmp1),
                                                    mir::inst::Value(num),
                                                    mir::inst::Op::Mul)));
                      insertInst(
                          blksIter->second.inst, i + ++offIndex,
                          std::unique_ptr<mir::inst::Inst>(
                              new mir::inst::OpInst(opPtr->dest, opPtr->lhs,
                                                    mir::inst::VarId(tmp2),
                                                    mir::inst::Op::Sub)));
                      blksIter->second.inst.erase(
                          blksIter->second.inst.begin() + i);
                      i--;
                    }
                  }
                }
                break;
              }
              default:
                break;
            }
            break;
          }
          default:
            break;
        }
      }
    }
  }